

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O2

QString * __thiscall
ImportBaseFuncWrapper::getShortName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QString functionName;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_28;
  
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  iVar2 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(this);
  pp_Var1 = (this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer;
  if ((char)iVar2 == '\0') {
    iVar2 = (*pp_Var1[0x33])(this);
    if ((char *)CONCAT44(extraout_var_00,iVar2) == (char *)0x0) {
      QString::QString(__return_storage_ptr__,"");
      goto LAB_00127bd4;
    }
    QString::operator=((QString *)&local_68,(char *)CONCAT44(extraout_var_00,iVar2));
  }
  else {
    iVar2 = (*pp_Var1[0x32])(this);
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    QString::asprintf((char *)&local_28,"<ord: %llX>",CONCAT44(extraout_var,iVar2));
    local_48.ptr = local_28.ptr;
    local_48.d = local_28.d;
    local_28.d = (Data *)0x0;
    local_28.ptr = (char16_t *)0x0;
    local_48.size = local_28.size;
    local_28.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    QString::operator=((QString *)&local_68,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QString::QString(__return_storage_ptr__,(QString *)&local_68);
LAB_00127bd4:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getShortName()
{
    QString functionName;
    if (isByOrdinal()) {
        uint64_t val = getOrdinal();
        QString out;
#if QT_VERSION >= 0x050000
        out = QString::asprintf("<ord: %llX>", static_cast<unsigned long long>(val));
#else
        out.sprintf("<ord: %llX>", static_cast<unsigned long long>(val));
#endif
        functionName = out;
    } else {
        char *fName = this->getFunctionName();
        if (!fName) return "";
        functionName = fName;
    }
    return functionName;
}